

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu1_v2.c
# Opt level: O1

MPP_RET hal_vp8e_vepu1_get_task_v2(void *hal,HalEncTask *task)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  RK_U8 *dst;
  long lVar4;
  undefined8 *puVar5;
  
  uVar3 = (ulong)(task->syntax).number;
  if (uVar3 != 0) {
    pvVar2 = (task->syntax).data;
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)pvVar2 + lVar4);
      puVar5 = (undefined8 *)((long)hal + 0x70);
      if ((iVar1 == 0) || (puVar5 = (undefined8 *)((long)hal + 0x158), iVar1 == 1)) {
        *puVar5 = *(undefined8 *)((long)pvVar2 + lVar4 + 8);
      }
      lVar4 = lVar4 + 0x10;
    } while (uVar3 << 4 != lVar4);
  }
  *(uint *)((long)hal + 0x6924) = (uint)(((ulong)task->rc_task->frm & 0x10) == 0);
  if ((*(int *)(*(long *)((long)hal + 0x70) + 0x368) == 0) && (*(int *)((long)hal + 0x6914) == 0)) {
    dst = (RK_U8 *)mpp_buffer_get_ptr_with_caller(task->output,"hal_vp8e_vepu1_get_task_v2");
    write_ivf_header(hal,dst);
    task->length = task->length + 0x20;
    *(undefined4 *)((long)hal + 0x6914) = 1;
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp8e_vepu1_get_task_v2(void *hal, HalEncTask *task)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;
    Vp8eSyntax* syntax = (Vp8eSyntax*)task->syntax.data;
    //ctx->cfg = syntax->cfg;
    RK_U32 i;

    for (i = 0; i < task->syntax.number; i++) {
        if (syntax[i].type == VP8E_SYN_CFG) {
            ctx->cfg = (MppEncCfgSet*)syntax[i].data;
        }
        if (syntax[i].type == VP8E_SYN_RC) {
            ctx->rc = (Vp8eRc*) syntax[i].data;
        }
    }

    ctx->frame_type = task->rc_task->frm.is_intra ? VP8E_FRM_KEY : VP8E_FRM_P;

    if (!ctx->cfg->codec.vp8.disable_ivf && !ctx->ivf_hdr_rdy) {
        RK_U8 *p_out = mpp_buffer_get_ptr(task->output);

        write_ivf_header(hal, p_out);
        task->length += IVF_HDR_BYTES;

        ctx->ivf_hdr_rdy = 1;
    }

    return MPP_OK;
}